

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_map(void)

{
  AMQP_VALUE_DATA *pAVar1;
  LOGGER_LOG p_Var2;
  
  pAVar1 = REFCOUNT_AMQP_VALUE_DATA_Create();
  if (pAVar1 == (AMQP_VALUE_DATA *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_create_map",0x5fe,1,"Could not allocate memory for AMQP value");
    }
  }
  else {
    pAVar1->type = AMQP_TYPE_MAP;
    (pAVar1->value).described_value.descriptor = (AMQP_VALUE)0x0;
    (pAVar1->value).binary_value.length = 0;
  }
  return pAVar1;
}

Assistant:

AMQP_VALUE amqpvalue_create_map(void)
{
    AMQP_VALUE result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
    if (result == NULL)
    {
        /* Codes_SRS_AMQPVALUE_01_179: [If allocating memory for the map fails, then amqpvalue_create_map shall return NULL.] */
        LogError("Could not allocate memory for AMQP value");
    }
    else
    {
        result->type = AMQP_TYPE_MAP;

        /* Codes_SRS_AMQPVALUE_01_180: [The number of key/value pairs in the newly created map shall be zero.] */
        result->value.map_value.pairs = NULL;
        result->value.map_value.pair_count = 0;
    }

    return result;
}